

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteObjGradients
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *this)

{
  NLHeader *pNVar1;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *in_RDI;
  SingleSparseDblVecWrtFactory vwf;
  int i;
  function<void_(int)> *hdr_prn;
  undefined4 in_stack_ffffffffffffff68;
  int iVar2;
  function<void_(int)> local_68;
  SingleSparseVecWrtFactory<int,_double> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  NLW2_NLFeeder_C_Impl *in_stack_ffffffffffffffe0;
  int local_c;
  
  local_c = 0;
  while( true ) {
    iVar2 = local_c;
    pNVar1 = Hdr(in_RDI);
    if ((pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_objs <= iVar2) break;
    hdr_prn = &local_68;
    std::function<void(int)>::
    function<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::WriteObjGradients()::_lambda(int)_1_,void>
              ((function<void_(int)> *)in_RDI,
               (anon_class_16_2_d708298c *)CONCAT44(iVar2,in_stack_ffffffffffffff68));
    SingleSparseVecWrtFactory<int,_double>::SingleSparseVecWrtFactory
              ((SingleSparseVecWrtFactory<int,_double> *)in_RDI,
               (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               CONCAT44(iVar2,in_stack_ffffffffffffff68),hdr_prn);
    std::function<void_(int)>::~function((function<void_(int)> *)0x112915);
    Feeder(in_RDI);
    NLW2_NLFeeder_C_Impl::
    FeedObjGradient<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SingleSparseVecWrtFactory<int,double>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    SingleSparseVecWrtFactory<int,_double>::~SingleSparseVecWrtFactory
              ((SingleSparseVecWrtFactory<int,_double> *)0x11293f);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteObjGradients() {
  for (int i=0; i<Hdr().num_objs; ++i) {
    SingleSparseDblVecWrtFactory
        vwf(*this,
            [i, this](int nnz){
      this->apr(this->nm, "G%d %d\n", i, nnz);
    });
    Feeder().FeedObjGradient(i, vwf);
  }
}